

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

void httplib::detail::get_remote_ip_and_port
               (sockaddr_storage *addr,socklen_t addr_len,string *ip,int *port)

{
  int iVar1;
  array<char,_1025UL> ipstr;
  char local_421 [1025];
  
  if ((addr->ss_family | 8) == 10) {
    *port = (uint)(ushort)(*(ushort *)addr->__ss_padding << 8 | *(ushort *)addr->__ss_padding >> 8);
  }
  memset(local_421,0,0x401);
  iVar1 = getnameinfo((sockaddr *)addr,addr_len,local_421,0x401,(char *)0x0,0,1);
  if (iVar1 == 0) {
    std::__cxx11::string::assign((char *)ip);
  }
  return;
}

Assistant:

inline void get_remote_ip_and_port(const struct sockaddr_storage &addr,
										   socklen_t addr_len, std::string &ip,
										   int &port) {
			if (addr.ss_family == AF_INET) {
				port = ntohs(reinterpret_cast<const struct sockaddr_in *>(&addr)->sin_port);
			} else if (addr.ss_family == AF_INET6) {
				port =
						ntohs(reinterpret_cast<const struct sockaddr_in6 *>(&addr)->sin6_port);
			}

			std::array<char, NI_MAXHOST> ipstr{};
			if (!getnameinfo(reinterpret_cast<const struct sockaddr *>(&addr), addr_len,
							 ipstr.data(), static_cast<socklen_t>(ipstr.size()), nullptr,
							 0, NI_NUMERICHOST)) {
				ip = ipstr.data();
			}
		}